

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::BinaryInstWriter,_void>::visit
          (Visitor<wasm::BinaryInstWriter,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::BinaryInstWriter,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      BinaryInstWriter::visitBlock((BinaryInstWriter *)this,(Block *)curr);
      break;
    case IfId:
      BinaryInstWriter::visitIf((BinaryInstWriter *)this,(If *)curr);
      break;
    case LoopId:
      BinaryInstWriter::visitLoop((BinaryInstWriter *)this,(Loop *)curr);
      break;
    case BreakId:
      BinaryInstWriter::visitBreak((BinaryInstWriter *)this,(Break *)curr);
      break;
    case SwitchId:
      BinaryInstWriter::visitSwitch((BinaryInstWriter *)this,(Switch *)curr);
      break;
    case CallId:
      BinaryInstWriter::visitCall((BinaryInstWriter *)this,(Call *)curr);
      break;
    case CallIndirectId:
      BinaryInstWriter::visitCallIndirect((BinaryInstWriter *)this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      BinaryInstWriter::visitLocalGet((BinaryInstWriter *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      BinaryInstWriter::visitLocalSet((BinaryInstWriter *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      BinaryInstWriter::visitGlobalGet((BinaryInstWriter *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      BinaryInstWriter::visitGlobalSet((BinaryInstWriter *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      BinaryInstWriter::visitLoad((BinaryInstWriter *)this,(Load *)curr);
      break;
    case StoreId:
      BinaryInstWriter::visitStore((BinaryInstWriter *)this,(Store *)curr);
      break;
    case ConstId:
      BinaryInstWriter::visitConst((BinaryInstWriter *)this,(Const *)curr);
      break;
    case UnaryId:
      BinaryInstWriter::visitUnary((BinaryInstWriter *)this,(Unary *)curr);
      break;
    case BinaryId:
      BinaryInstWriter::visitBinary((BinaryInstWriter *)this,(Binary *)curr);
      break;
    case SelectId:
      BinaryInstWriter::visitSelect((BinaryInstWriter *)this,(Select *)curr);
      break;
    case DropId:
      BinaryInstWriter::visitDrop((BinaryInstWriter *)this,(Drop *)curr);
      break;
    case ReturnId:
      BinaryInstWriter::visitReturn((BinaryInstWriter *)this,(Return *)curr);
      break;
    case MemorySizeId:
      BinaryInstWriter::visitMemorySize((BinaryInstWriter *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      BinaryInstWriter::visitMemoryGrow((BinaryInstWriter *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      BinaryInstWriter::visitNop((BinaryInstWriter *)this,(Nop *)curr);
      break;
    case UnreachableId:
      BinaryInstWriter::visitUnreachable((BinaryInstWriter *)this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      BinaryInstWriter::visitAtomicRMW((BinaryInstWriter *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      BinaryInstWriter::visitAtomicCmpxchg((BinaryInstWriter *)this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      BinaryInstWriter::visitAtomicWait((BinaryInstWriter *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      BinaryInstWriter::visitAtomicNotify((BinaryInstWriter *)this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      BinaryInstWriter::visitAtomicFence((BinaryInstWriter *)this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      BinaryInstWriter::visitSIMDExtract((BinaryInstWriter *)this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      BinaryInstWriter::visitSIMDReplace((BinaryInstWriter *)this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      BinaryInstWriter::visitSIMDShuffle((BinaryInstWriter *)this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      BinaryInstWriter::visitSIMDTernary((BinaryInstWriter *)this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      BinaryInstWriter::visitSIMDShift((BinaryInstWriter *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      BinaryInstWriter::visitSIMDLoad((BinaryInstWriter *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      BinaryInstWriter::visitSIMDLoadStoreLane((BinaryInstWriter *)this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      BinaryInstWriter::visitMemoryInit((BinaryInstWriter *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      BinaryInstWriter::visitDataDrop((BinaryInstWriter *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      BinaryInstWriter::visitMemoryCopy((BinaryInstWriter *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      BinaryInstWriter::visitMemoryFill((BinaryInstWriter *)this,(MemoryFill *)curr);
      break;
    case PopId:
      BinaryInstWriter::visitPop((BinaryInstWriter *)this,(Pop *)curr);
      break;
    case RefNullId:
      BinaryInstWriter::visitRefNull((BinaryInstWriter *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      BinaryInstWriter::visitRefIsNull((BinaryInstWriter *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      BinaryInstWriter::visitRefFunc((BinaryInstWriter *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      BinaryInstWriter::visitRefEq((BinaryInstWriter *)this,(RefEq *)curr);
      break;
    case TableGetId:
      BinaryInstWriter::visitTableGet((BinaryInstWriter *)this,(TableGet *)curr);
      break;
    case TableSetId:
      BinaryInstWriter::visitTableSet((BinaryInstWriter *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      BinaryInstWriter::visitTableSize((BinaryInstWriter *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      BinaryInstWriter::visitTableGrow((BinaryInstWriter *)this,(TableGrow *)curr);
      break;
    case TableFillId:
      BinaryInstWriter::visitTableFill((BinaryInstWriter *)this,(TableFill *)curr);
      break;
    case TableCopyId:
      BinaryInstWriter::visitTableCopy((BinaryInstWriter *)this,(TableCopy *)curr);
      break;
    case TableInitId:
      BinaryInstWriter::visitTableInit((BinaryInstWriter *)this,(TableInit *)curr);
      break;
    case TryId:
      BinaryInstWriter::visitTry((BinaryInstWriter *)this,(Try *)curr);
      break;
    case TryTableId:
      BinaryInstWriter::visitTryTable((BinaryInstWriter *)this,(TryTable *)curr);
      break;
    case ThrowId:
      BinaryInstWriter::visitThrow((BinaryInstWriter *)this,(Throw *)curr);
      break;
    case RethrowId:
      BinaryInstWriter::visitRethrow((BinaryInstWriter *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      BinaryInstWriter::visitThrowRef((BinaryInstWriter *)this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      BinaryInstWriter::visitTupleMake((BinaryInstWriter *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      BinaryInstWriter::visitTupleExtract((BinaryInstWriter *)this,(TupleExtract *)curr);
      break;
    case RefI31Id:
      BinaryInstWriter::visitRefI31((BinaryInstWriter *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      BinaryInstWriter::visitI31Get((BinaryInstWriter *)this,(I31Get *)curr);
      break;
    case CallRefId:
      BinaryInstWriter::visitCallRef((BinaryInstWriter *)this,(CallRef *)curr);
      break;
    case RefTestId:
      BinaryInstWriter::visitRefTest((BinaryInstWriter *)this,(RefTest *)curr);
      break;
    case RefCastId:
      BinaryInstWriter::visitRefCast((BinaryInstWriter *)this,(RefCast *)curr);
      break;
    case BrOnId:
      BinaryInstWriter::visitBrOn((BinaryInstWriter *)this,(BrOn *)curr);
      break;
    case StructNewId:
      BinaryInstWriter::visitStructNew((BinaryInstWriter *)this,(StructNew *)curr);
      break;
    case StructGetId:
      BinaryInstWriter::visitStructGet((BinaryInstWriter *)this,(StructGet *)curr);
      break;
    case StructSetId:
      BinaryInstWriter::visitStructSet((BinaryInstWriter *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      BinaryInstWriter::visitStructRMW((BinaryInstWriter *)this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      BinaryInstWriter::visitStructCmpxchg((BinaryInstWriter *)this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      BinaryInstWriter::visitArrayNew((BinaryInstWriter *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      BinaryInstWriter::visitArrayNewData((BinaryInstWriter *)this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      BinaryInstWriter::visitArrayNewElem((BinaryInstWriter *)this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      BinaryInstWriter::visitArrayNewFixed((BinaryInstWriter *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      BinaryInstWriter::visitArrayGet((BinaryInstWriter *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      BinaryInstWriter::visitArraySet((BinaryInstWriter *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      BinaryInstWriter::visitArrayLen((BinaryInstWriter *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      BinaryInstWriter::visitArrayCopy((BinaryInstWriter *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      BinaryInstWriter::visitArrayFill((BinaryInstWriter *)this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      BinaryInstWriter::visitArrayInitData((BinaryInstWriter *)this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      BinaryInstWriter::visitArrayInitElem((BinaryInstWriter *)this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      BinaryInstWriter::visitRefAs((BinaryInstWriter *)this,(RefAs *)curr);
      break;
    case StringNewId:
      BinaryInstWriter::visitStringNew((BinaryInstWriter *)this,(StringNew *)curr);
      break;
    case StringConstId:
      BinaryInstWriter::visitStringConst((BinaryInstWriter *)this,(StringConst *)curr);
      break;
    case StringMeasureId:
      BinaryInstWriter::visitStringMeasure((BinaryInstWriter *)this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      BinaryInstWriter::visitStringEncode((BinaryInstWriter *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      BinaryInstWriter::visitStringConcat((BinaryInstWriter *)this,(StringConcat *)curr);
      break;
    case StringEqId:
      BinaryInstWriter::visitStringEq((BinaryInstWriter *)this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      BinaryInstWriter::visitStringWTF16Get((BinaryInstWriter *)this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      BinaryInstWriter::visitStringSliceWTF((BinaryInstWriter *)this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      BinaryInstWriter::visitContNew((BinaryInstWriter *)this,(ContNew *)curr);
      break;
    case ContBindId:
      BinaryInstWriter::visitContBind((BinaryInstWriter *)this,(ContBind *)curr);
      break;
    case SuspendId:
      BinaryInstWriter::visitSuspend((BinaryInstWriter *)this,(Suspend *)curr);
      break;
    case ResumeId:
      BinaryInstWriter::visitResume((BinaryInstWriter *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      BinaryInstWriter::visitResumeThrow((BinaryInstWriter *)this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      BinaryInstWriter::visitStackSwitch((BinaryInstWriter *)this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::BinaryInstWriter>::visit(Expression *) [SubType = wasm::BinaryInstWriter, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }